

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall QRenderRule::originRect(QRenderRule *this,QRect *rect,Origin origin)

{
  long lVar1;
  QRenderRule *this_00;
  int in_EDX;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRenderRule *)(ulong)(in_EDX - 1);
  switch(this_00) {
  case (QRenderRule *)0x0:
    local_18 = paddingRect(this_00,in_RDI);
    break;
  case (QRenderRule *)0x1:
    local_18 = borderRect(this_00,in_RDI);
    break;
  case (QRenderRule *)0x2:
    local_18 = contentsRect(this_00,in_RDI);
    break;
  case (QRenderRule *)0x3:
  default:
    local_18 = *in_RSI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QRect QRenderRule::originRect(const QRect &rect, Origin origin) const
{
    switch (origin) {
    case Origin_Padding:
        return paddingRect(rect);
    case Origin_Border:
        return borderRect(rect);
    case Origin_Content:
        return contentsRect(rect);
    case Origin_Margin:
    default:
        return rect;
    }
}